

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O3

char * __thiscall
testing::internal::TypedTestSuitePState::VerifyRegisteredTestNames
          (TypedTestSuitePState *this,char *test_suite_name,char *file,int line,
          char *registered_tests)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
  *this_00;
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  _Alloc_hider _Var7;
  const_iterator cVar8;
  const_iterator cVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  _Base_ptr p_Var12;
  ulong uVar13;
  ostream *poVar14;
  char *pcVar15;
  long lVar16;
  pointer __k;
  char *pcVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string local_130;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  TypedTestSuitePState *local_108;
  uint local_fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_e0 [32];
  _Base_ptr local_c0;
  size_t local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  internal *local_90;
  char *local_88;
  _Base_ptr local_80;
  CodeLocation local_78;
  string local_50;
  
  local_108 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,file,(allocator<char> *)local_e0);
  paVar2 = &local_78.file.field_2;
  if (local_b0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_a0) {
    local_78.file.field_2._8_8_ = uStack_98;
    local_78.file._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_78.file._M_dataplus._M_p = (pointer)local_b0;
  }
  local_78.file.field_2._M_allocated_capacity._1_7_ = uStack_9f;
  local_78.file.field_2._M_local_buf[0] = local_a0;
  local_78.file._M_string_length = local_a8;
  local_a8 = 0;
  local_a0 = '\0';
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_a0;
  local_78.line = line;
  RegisterTypeParameterizedTestSuite(test_suite_name,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  *local_108 = (TypedTestSuitePState)0x1;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar15 = registered_tests + -1;
  local_fc = line;
  local_90 = (internal *)file;
  local_88 = registered_tests;
  do {
    pbVar1 = (byte *)(pcVar15 + 1);
    pcVar15 = pcVar15 + 1;
    iVar4 = isspace((uint)*pbVar1);
  } while (iVar4 != 0);
  do {
    pcVar5 = strchr(pcVar15,0x2c);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    if (pcVar5 == (char *)0x0) {
      sVar6 = strlen(pcVar15);
      pcVar5 = pcVar15 + sVar6;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,pcVar15,pcVar5);
    _Var7._M_p = local_130._M_dataplus._M_p;
    if (local_130._M_string_length != 0) {
      pcVar5 = local_130._M_dataplus._M_p + local_130._M_string_length;
      do {
        _Var3._M_p = local_130._M_dataplus._M_p;
        iVar4 = isspace((uint)(byte)pcVar5[-1]);
        _Var7._M_p = _Var3._M_p;
        if (iVar4 == 0) break;
        pcVar17 = pcVar5 + -1;
        uVar13 = (long)pcVar17 - (long)_Var3._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_130,uVar13);
        pcVar5 = local_130._M_dataplus._M_p + uVar13;
        _Var7._M_p = local_130._M_dataplus._M_p;
      } while (pcVar17 != _Var3._M_p);
    }
    paVar2 = &local_130.field_2;
    local_e0._0_8_ = _Var7._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p == paVar2) {
      local_e0._24_8_ = local_130.field_2._8_8_;
      local_e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_e0 + 0x10);
    }
    local_e0._17_7_ = local_130.field_2._M_allocated_capacity._1_7_;
    local_e0[0x10] = local_130.field_2._M_local_buf[0];
    local_e0._8_8_ = local_130._M_string_length;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    pcVar15 = strchr(pcVar15,0x2c);
    if (pcVar15 == (char *)0x0) break;
    do {
      pbVar1 = (byte *)(pcVar15 + 1);
      pcVar15 = pcVar15 + 1;
      iVar4 = isspace((uint)*pbVar1);
    } while (iVar4 != 0);
  } while( true );
  Message::Message((Message *)&local_110);
  p_Var12 = (_Base_ptr)(local_e0 + 8);
  local_e0._8_8_ = local_e0._8_8_ & 0xffffffff00000000;
  local_e0._16_8_ = 0;
  local_b8 = 0;
  local_e0._24_8_ = p_Var12;
  local_c0 = p_Var12;
  if (local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar14 = (ostream *)(local_110._M_head_impl + 0x10);
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
               *)(local_108 + 8);
    local_80 = (_Base_ptr)(local_108 + 0x10);
    __k = local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e0,__k);
      p_Var12 = (_Base_ptr)(local_e0 + 8);
      if (cVar8._M_node == p_Var12) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                ::find(this_00,__k);
        if (cVar9._M_node == local_80) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"No test named ",0xe);
          lVar16 = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          pcVar15 = " can be found in this test suite.\n";
          goto LAB_00140890;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_e0,__k);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Test ",5);
        lVar16 = 0x1b;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        pcVar15 = " is listed more than once.\n";
LAB_00140890:
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar15,lVar16);
      }
      __k = __k + 1;
    } while (__k != local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  iVar4 = (int)p_Var12;
  p_Var11 = *(_Rb_tree_node_base **)(local_108 + 0x20);
  p_Var10 = (_Rb_tree_node_base *)(local_108 + 0x10);
  if (p_Var11 != p_Var10) {
    do {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e0,(key_type *)(p_Var11 + 1));
      p_Var12 = (_Base_ptr)(local_e0 + 8);
      if (cVar8._M_node == p_Var12) {
        poVar14 = (ostream *)(local_110._M_head_impl + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,".\n",2);
      }
      iVar4 = (int)p_Var12;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != p_Var10);
  }
  StringStreamToString(&local_130,local_110._M_head_impl);
  pcVar15 = local_88;
  if (local_130._M_string_length != 0) {
    FormatFileLocation_abi_cxx11_(&local_50,local_90,(char *)(ulong)local_fc,iVar4);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e0);
    if (local_110._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))(local_110._M_head_impl);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e0);
  if (local_110._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_110._M_head_impl + 8))(local_110._M_head_impl);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return pcVar15;
}

Assistant:

const char* TypedTestSuitePState::VerifyRegisteredTestNames(
    const char* test_suite_name, const char* file, int line,
    const char* registered_tests) {
  RegisterTypeParameterizedTestSuite(test_suite_name, CodeLocation(file, line));

  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    if (registered_tests_.count(name) != 0) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test suite.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end(); ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (!errors_str.empty()) {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}